

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

ssize_t __thiscall tcu::FileResource::read(FileResource *this,int __fd,void *__buf,size_t __nbytes)

{
  deBool dVar1;
  size_t sVar2;
  TestError *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  int numRead;
  int numBytes_local;
  deUint8 *dst_local;
  FileResource *this_local;
  
  sVar2 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)(int)__buf,(FILE *)this->m_file)
  ;
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((int)sVar2 != (int)__buf)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return CONCAT44(extraout_var,dVar1);
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,(char *)0x0,"numRead == numBytes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuResource.cpp"
             ,0x40);
  __cxa_throw(this_00,&TestError::typeinfo,TestError::~TestError);
}

Assistant:

void FileResource::read (deUint8* dst, int numBytes)
{
	int numRead = (int)fread(dst, 1, numBytes, m_file);
	TCU_CHECK(numRead == numBytes);
}